

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::objectivec::TextFormatDecodeData::Data_abi_cxx11_
          (string *__return_storage_ptr__,TextFormatDecodeData *this)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  pointer ppVar6;
  CodedOutputStream output_stream;
  OstreamOutputStream data_outputstream;
  ostringstream data_stringstream;
  CodedOutputStream local_200;
  OstreamOutputStream local_1e0;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  if ((this->entries_).
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->entries_).
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    io::OstreamOutputStream::OstreamOutputStream(&local_1e0,(ostream *)local_198,-1);
    io::CodedOutputStream::CodedOutputStream(&local_200,&local_1e0.super_ZeroCopyOutputStream);
    uVar5 = (int)((ulong)((long)(this->entries_).
                                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->entries_).
                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    if (local_200.buffer_size_ < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(&local_200,uVar5);
    }
    else {
      pbVar3 = local_200.buffer_;
      uVar4 = uVar5;
      if (0x7f < uVar5) {
        do {
          *pbVar3 = (byte)uVar5 | 0x80;
          uVar4 = uVar5 >> 7;
          pbVar3 = pbVar3 + 1;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
      *pbVar3 = (byte)uVar4;
      iVar2 = ((int)pbVar3 - (int)local_200.buffer_) + 1;
      local_200.buffer_ = local_200.buffer_ + iVar2;
      local_200.buffer_size_ = local_200.buffer_size_ - iVar2;
    }
    ppVar6 = (this->entries_).
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (ppVar6 != (this->entries_).
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        uVar5 = ppVar6->first;
        if (local_200.buffer_size_ < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(&local_200,uVar5);
        }
        else {
          pbVar3 = local_200.buffer_;
          uVar4 = uVar5;
          if (0x7f < uVar5) {
            do {
              *pbVar3 = (byte)uVar5 | 0x80;
              uVar4 = uVar5 >> 7;
              pbVar3 = pbVar3 + 1;
              bVar1 = 0x3fff < uVar5;
              uVar5 = uVar4;
            } while (bVar1);
          }
          *pbVar3 = (byte)uVar4;
          iVar2 = ((int)pbVar3 - (int)local_200.buffer_) + 1;
          local_200.buffer_ = local_200.buffer_ + iVar2;
          local_200.buffer_size_ = local_200.buffer_size_ - iVar2;
        }
        io::CodedOutputStream::WriteRaw
                  (&local_200,(ppVar6->second)._M_dataplus._M_p,
                   (int)(ppVar6->second)._M_string_length);
        ppVar6 = ppVar6 + 1;
      } while (ppVar6 != (this->entries_).
                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    io::CodedOutputStream::~CodedOutputStream(&local_200);
    io::OstreamOutputStream::~OstreamOutputStream(&local_1e0);
  }
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string TextFormatDecodeData::Data() const {
  ostringstream data_stringstream;

  if (num_entries() > 0) {
    io::OstreamOutputStream data_outputstream(&data_stringstream);
    io::CodedOutputStream output_stream(&data_outputstream);

    output_stream.WriteVarint32(num_entries());
    for (vector<DataEntry>::const_iterator i = entries_.begin();
         i != entries_.end(); ++i) {
      output_stream.WriteVarint32(i->first);
      output_stream.WriteString(i->second);
    }
  }

  data_stringstream.flush();
  return data_stringstream.str();
}